

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O3

uint attr_wrapper::get_attribute<unsigned_int>(Value *doc,char *name)

{
  ConstMemberIterator CVar1;
  Type_error *__return_storage_ptr__;
  allocator local_61;
  string local_60;
  string local_40;
  
  CVar1 = get_loc(doc,name);
  if ((((CVar1.ptr_)->value).flags_ & 0x800) != 0) {
    return *(uint *)&((CVar1.ptr_)->value).data_;
  }
  __return_storage_ptr__ = (Type_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_40,name,&local_61);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"n unsigned integer.","");
  genTypeError(__return_storage_ptr__,&local_40,&local_60);
  __cxa_throw(__return_storage_ptr__,&Type_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline unsigned get_attribute<unsigned>(const rapidjson::Value& doc,
                                           const char* name)
   {
      auto loc = get_loc(doc, name);
      if(!loc->value.IsUint())
      {
         throw genTypeError(name, "n unsigned integer.");
      }
      return loc->value.GetUint();
   }